

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::
interpret_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
          (interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this)

{
  uint local_14;
  interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
  *local_10;
  interpreter<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
  *this_local;
  
  local_10 = this;
  local_14 = consume<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
                       (this);
  produce<mvm::value_stack<mvm::list::mplist<unsigned_int>>,unsigned_int,unsigned_int>
            (this,&local_14);
  return;
}

Assistant:

void interpreter<Set, InstancesList>::interpret_instr() {
  if constexpr (concept ::is_producer_v<I>) {
    this->produce<
        instance_of_tie_t<instance_list_type,
                          typename traits::producers_traits<I>::producer_type>,
        typename traits::producers_traits<I>::data_type>(this->consume<I>());
  } else {
    this->consume<I>();
  }
}